

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_multiset_int64_Test::TestBody(Btree_multiset_int64_Test *this)

{
  undefined1 auVar1 [8];
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false> _Var2;
  size_type sVar3;
  ulong uVar4;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
  _Var5;
  void *__s;
  pointer p;
  pointer p_00;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
  _Var6;
  vector<long,_std::allocator<long>_> *extraout_RDX;
  vector<long,_std::allocator<long>_> *extraout_RDX_00;
  vector<long,_std::allocator<long>_> *values;
  undefined8 extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_00;
  vector<long,_std::allocator<long>_> *values_01;
  vector<long,_std::allocator<long>_> *values_02;
  vector<long,_std::allocator<long>_> *values_03;
  const_pointer extraout_RDX_02;
  const_pointer extraout_RDX_03;
  const_pointer hint;
  const_pointer hint_00;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_08;
  size_type n_00;
  long lVar7;
  int i;
  size_type n_01;
  pointer plVar8;
  char *pcVar9;
  btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
  *__tmp;
  value_type_conflict *__val;
  bool bVar10;
  AssertionResult AVar11;
  vector<long,_std::allocator<long>_> sorted_values;
  vector<long,_std::allocator<long>_> random_values;
  int64_t original_bytes1;
  vector<long,_std::allocator<long>_> duplicate_values;
  multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  container;
  PropagatingCountingAlloc<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator1;
  vector<long,_std::allocator<long>_> identical_values;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  AssertHelper local_108;
  undefined1 local_100 [8];
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
  local_f8;
  pointer local_f0;
  undefined1 local_e8 [32];
  _Base_ptr local_c8;
  vector<long,_std::allocator<long>_> local_c0;
  btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
  local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  CountingAllocator<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  local_58;
  CountingAllocator<long> local_50;
  void *local_48;
  void *pvStack_40;
  long local_38;
  
  (anonymous_namespace)::
  ConstTest<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>>();
  GenerateValuesWithSeed<long>
            ((vector<long,_std::allocator<long>_> *)local_e8,10000,40000,
             testing::FLAGS_gtest_random_seed);
  local_a8.size_ = (size_type)&local_a8;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
        )&btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>::
          EmptyNode()::empty_node;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>.
  _M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)
       &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>::
        EmptyNode()::empty_node;
  local_a8.rightmost_ = (node_type *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_100,
             (vector<long,_std::allocator<long>_> *)local_e8);
  _Var6._M_head_impl = local_f8._M_head_impl;
  auVar1 = local_100;
  values = extraout_RDX;
  if (local_100 != (undefined1  [8])local_f8._M_head_impl) {
    uVar4 = (long)local_f8._M_head_impl - (long)local_100 >> 3;
    lVar7 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_100,local_f8._M_head_impl,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar1,_Var6._M_head_impl);
    values = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_100,values);
  values_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),
                       local_100 != (undefined1  [8])local_f8._M_head_impl);
  _Var6._M_head_impl = local_f8._M_head_impl + -8;
  if ((ulong)local_100 < _Var6._M_head_impl && local_100 != (undefined1  [8])local_f8._M_head_impl)
  {
    _Var5._M_head_impl =
         (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          *)((long)local_100 + 8);
    do {
      plVar8 = ((_Vector_impl_data *)(_Var5._M_head_impl + -8))->_M_start;
      ((_Vector_impl_data *)(_Var5._M_head_impl + -8))->_M_start = *(pointer *)_Var6._M_head_impl;
      *(pointer *)_Var6._M_head_impl = plVar8;
      _Var6._M_head_impl = _Var6._M_head_impl + -8;
      values_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_Var5._M_head_impl + 8);
      bVar10 = _Var5._M_head_impl < _Var6._M_head_impl;
      _Var5._M_head_impl =
           (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
            *)values_00;
    } while (bVar10);
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_100,(vector<long,_std::allocator<long>_> *)values_00);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_e8,values_01);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_c0,(vector<long,_std::allocator<long>_> *)local_e8);
  std::vector<long,std::allocator<long>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
            ((vector<long,std::allocator<long>> *)&local_c0,
             local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish,local_e8._0_8_,local_e8._8_8_);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              *)&local_c0,values_02);
  local_48 = (void *)0x0;
  pvStack_40 = (void *)0x0;
  local_38 = 0;
  __s = operator_new(800);
  lVar7 = 0;
  local_48 = __s;
  pvStack_40 = __s;
  local_38 = (long)__s + 800;
  memset(__s,0,800);
  do {
    *(undefined8 *)((long)__s + lVar7) = 2;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 800);
  pvStack_40 = (void *)((long)__s + 800);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              *)&local_48,values_03);
  n_01 = 800;
  operator_delete(__s,800);
  if ((_Base_ptr)
      local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (_Base_ptr)0x0) {
    n_01 = (long)local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage -
           (long)local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
    operator_delete(local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,n_01);
  }
  if ((_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
       )local_100 !=
      (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
       *)0x0) {
    n_01 = (long)local_f0 - (long)local_100;
    operator_delete((void *)local_100,n_01);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>::~btree
            ((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
              *)&local_a8);
  hint = extraout_RDX_02;
  if ((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
       *)local_e8._0_8_ !=
      (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
       *)0x0) {
    n_01 = local_e8._16_8_ - local_e8._0_8_;
    operator_delete((void *)local_e8._0_8_,n_01);
    hint = extraout_RDX_03;
  }
  local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48 = (void *)0x0;
  local_58.bytes_used_ = (int64_t *)&local_48;
  local_50.bytes_used_ = (int64_t *)&local_c0;
  p = CountingAllocator<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
      ::allocate((CountingAllocator<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
                  *)&local_50,n_01,hint);
  p_00 = CountingAllocator<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
         ::allocate(&local_58,n_01,hint_00);
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
         ::EmptyNode()::empty_node;
  local_a8.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_a8.size_ = 0;
  local_e8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._24_8_ = (_Base_ptr)0x0;
  local_c8 = (_Base_ptr)
             local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = (undefined1  [8])0x0;
  local_e8._8_8_ = &local_48;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>.
  _M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)(PropagatingCountingAlloc<long>)&local_c0;
  btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
            *)&local_a8,(value_type *)local_100);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      plVar8 = (pointer)0x40542f;
    }
    else {
      plVar8 = (((_Vector_base<long,_std::allocator<long>_> *)&(local_f8._M_head_impl)->field_0x0)->
               _M_impl).super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,(char *)plVar8);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  if (local_a8.size_ != 0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear(&local_a8,
                     (node_type *)
                     local_a8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
         ::EmptyNode()::empty_node;
  local_a8.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_a8.size_ = 0;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>.
  _M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)(PropagatingCountingAlloc<long>)local_e8._8_8_;
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b1.size()","0",(unsigned_long *)&local_110,(int *)&local_108);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._24_8_;
  local_108.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b2.size()","0",(unsigned_long *)&local_110,(int *)&local_108);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((_Base_ptr)local_110._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((_Base_ptr)local_110._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  _Var6._M_head_impl =
       (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
        *)0x1;
  do {
    local_100 = (undefined1  [8])_Var6._M_head_impl;
    btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
              *)&local_a8,(value_type *)local_100);
    _Var6._M_head_impl = _Var6._M_head_impl + 1;
  } while (_Var6._M_head_impl !=
           (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
            *)0x3e8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes2","bytes1",(long *)&local_48,(long *)&local_c0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((_Base_ptr)local_110._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  if ((_Base_ptr)local_e8._24_8_ != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
                      *)local_e8,(node_type *)local_e8._0_8_);
  }
  if (local_a8.size_ != 0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear(&local_a8,
                     (node_type *)
                     local_a8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
         ::EmptyNode()::empty_node;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>.
  _M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)(PropagatingCountingAlloc<long>)local_50.bytes_used_;
  local_a8.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_a8.size_ = 0;
  local_e8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._8_8_ = local_58.bytes_used_;
  local_e8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._24_8_ = (_Base_ptr)0x0;
  local_c8 = (_Base_ptr)
             local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = (undefined1  [8])0x0;
  btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
            *)&local_a8,(value_type *)local_100);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((_Base_ptr)local_110._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  if (local_a8.size_ != 0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear(&local_a8,
                     (node_type *)
                     local_a8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  _Var2._M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       local_a8.root_.
       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
       .
       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>
       ._M_head_impl.super_CountingAllocator<long>.bytes_used_;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
         ::EmptyNode()::empty_node;
  local_a8.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_a8.size_ = 0;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>.
  _M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)(PropagatingCountingAlloc<long>)local_e8._8_8_;
  local_e8._8_8_ = _Var2._M_head_impl.super_CountingAllocator<long>.bytes_used_;
  local_e8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._24_8_ = (_Base_ptr)0x0;
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b1.size()","0",(unsigned_long *)&local_110,(int *)&local_108);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  _Var6._M_head_impl =
       (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
        *)0x1;
  do {
    local_100 = (undefined1  [8])_Var6._M_head_impl;
    btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
              *)&local_a8,(value_type *)local_100);
    _Var6._M_head_impl = _Var6._M_head_impl + 1;
  } while (_Var6._M_head_impl !=
           (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
            *)0x3e8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes2","bytes1",(long *)&local_48,(long *)&local_c0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  if ((_Base_ptr)local_e8._24_8_ != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
                      *)local_e8,(node_type *)local_e8._0_8_);
  }
  if (local_a8.size_ != 0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear(&local_a8,
                     (node_type *)
                     local_a8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
         ::EmptyNode()::empty_node;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>.
  _M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)(PropagatingCountingAlloc<long>)local_50.bytes_used_;
  local_a8.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_a8.size_ = 0;
  local_e8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._8_8_ = local_58.bytes_used_;
  local_e8._16_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_e8._24_8_ = (_Base_ptr)0x0;
  local_c8 = (_Base_ptr)
             local_c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = (undefined1  [8])0x0;
  btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
            *)&local_a8,(value_type *)local_100);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  sVar3 = local_a8.size_;
  local_e8._16_8_ = local_a8.rightmost_;
  _Var2._M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       local_a8.root_.
       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
       .
       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>
       ._M_head_impl.super_CountingAllocator<long>.bytes_used_;
  local_e8._0_8_ =
       local_a8.root_.
       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
       .
       super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  ;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>.
  _M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)(PropagatingCountingAlloc<long>)local_e8._8_8_;
  local_a8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
         ::EmptyNode()::empty_node;
  local_e8._8_8_ = _Var2._M_head_impl.super_CountingAllocator<long>.bytes_used_;
  local_a8.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,true>>
       ::EmptyNode()::empty_node;
  local_a8.size_ = 0;
  local_e8._24_8_ = sVar3;
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b1.size()","0",(unsigned_long *)&local_110,(int *)&local_108);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar3;
  local_108.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b2.size()","1",(unsigned_long *)&local_110,(int *)&local_108);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((_Base_ptr)local_110._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((_Base_ptr)local_110._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
  }
  _Var6._M_head_impl =
       (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
        *)0x1;
  do {
    local_100 = (undefined1  [8])_Var6._M_head_impl;
    btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_>
              *)&local_a8,(value_type *)local_100);
    _Var6._M_head_impl = _Var6._M_head_impl + 1;
  } while (_Var6._M_head_impl !=
           (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
            *)0x3e8);
  AVar11 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_100,"bytes2","bytes1",(long *)&local_48,(long *)&local_c0);
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar11.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&(local_f8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    n = extraout_RDX_04.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if ((_Base_ptr)local_110._M_head_impl != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
      n._M_head_impl = extraout_RDX_05;
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl);
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_06.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((_Base_ptr)local_e8._24_8_ != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
                      *)local_e8,(node_type *)local_e8._0_8_);
    n._M_head_impl = extraout_RDX_07;
  }
  if (local_a8.size_ != 0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
    ::internal_clear(&local_a8,
                     (node_type *)
                     local_a8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
                     ._M_head_impl);
    n._M_head_impl = extraout_RDX_08._M_head_impl;
  }
  CountingAllocator<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate((CountingAllocator<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
                *)&local_50,p,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_multiset<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate(&local_58,p_00,n_00);
  return;
}

Assistant:

void BtreeMultiTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        multi_checker<T, C> container;

        // Test keys in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test keys in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test keys in random order.
        DoTest("random:    ", &container, random_values);

        // Test keys in random order w/ duplicates.
        std::vector<V> duplicate_values(random_values);
        duplicate_values.insert(duplicate_values.end(), random_values.begin(),
                                random_values.end());
        DoTest("duplicates:", &container, duplicate_values);

        // Test all identical keys.
        std::vector<V> identical_values(100);
        std::fill(identical_values.begin(), identical_values.end(),
                  Generator<V>(2)(2));
        DoTest("identical: ", &container, identical_values);
    }